

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2_provider.hpp
# Opt level: O3

void __thiscall
digestpp::detail::sha2_provider<unsigned_long,_0UL>::transform
          (sha2_provider<unsigned_long,_0UL> *this,uchar *data,size_t num_blks)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [11];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  unsigned_long uVar30;
  unsigned_long uVar31;
  ulong uVar32;
  ulong uVar33;
  size_t sVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  unsigned_long uVar38;
  long lVar39;
  unsigned_long uVar40;
  ulong uVar41;
  unsigned_long uVar42;
  unsigned_long uVar43;
  ulong *puVar44;
  ulong uVar45;
  ulong *puVar46;
  ulong uVar47;
  ulong uVar48;
  unsigned_long uVar49;
  ulong uVar50;
  unsigned_long uVar51;
  unsigned_long uVar52;
  ulong uVar53;
  unsigned_long uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [11];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  unsigned_long W [80];
  undefined8 local_338;
  undefined8 uStack_330;
  long alStack_2f0 [5];
  ulong auStack_2c8 [83];
  undefined1 auVar57 [15];
  
  if (num_blks != 0) {
    uVar37 = (this->H)._M_elems[0];
    uVar51 = (this->H)._M_elems[1];
    uVar49 = (this->H)._M_elems[2];
    uVar43 = (this->H)._M_elems[3];
    uVar38 = (this->H)._M_elems[4];
    uVar52 = (this->H)._M_elems[5];
    uVar32 = (this->H)._M_elems[6];
    uVar33 = (this->H)._M_elems[7];
    sVar34 = 0;
    do {
      lVar35 = 0;
      do {
        auVar55 = *(undefined1 (*) [16])(data + lVar35 * 8);
        auVar59[8] = auVar55[8];
        auVar59[9] = 0;
        auVar59[10] = auVar55[9];
        auVar56._0_10_ = (unkuint10)auVar55[0xc] << 0x40;
        auVar56[10] = auVar55[0xd];
        auVar57[0xb] = 0;
        auVar57._0_11_ = auVar56;
        auVar57[0xc] = auVar55[0xe];
        auVar57[0xd] = 0;
        auVar57[0xe] = auVar55[0xf];
        auVar59[3] = 0;
        auVar59._0_3_ = auVar56._8_3_;
        auVar59._4_3_ = auVar57._12_3_;
        auVar59[7] = 0;
        auVar59[0xb] = 0;
        auVar59._12_3_ = (int3)(CONCAT16(auVar55[0xb],(uint6)auVar55[10] << 0x20) >> 0x20);
        auVar59[0xf] = 0;
        auVar58 = pshuflw(auVar59,auVar59,0x1b);
        auVar59 = pshufhw(auVar58,auVar58,0x1b);
        auVar18[0xd] = 0;
        auVar18._0_13_ = auVar55._0_13_;
        auVar18[0xe] = auVar55[7];
        auVar19[0xc] = auVar55[6];
        auVar19._0_12_ = auVar55._0_12_;
        auVar19._13_2_ = auVar18._13_2_;
        auVar20[0xb] = 0;
        auVar20._0_11_ = auVar55._0_11_;
        auVar20._12_3_ = auVar19._12_3_;
        auVar21[10] = auVar55[5];
        auVar21._0_10_ = auVar55._0_10_;
        auVar21._11_4_ = auVar20._11_4_;
        auVar22[9] = 0;
        auVar22._0_9_ = auVar55._0_9_;
        auVar22._10_5_ = auVar21._10_5_;
        auVar23[8] = auVar55[4];
        auVar23._0_8_ = auVar55._0_8_;
        auVar23._9_6_ = auVar22._9_6_;
        auVar58[7] = 0;
        auVar58._0_7_ = auVar23._8_7_;
        auVar26._7_8_ = 0;
        auVar26._0_7_ = auVar23._8_7_;
        auVar28._1_8_ = SUB158(auVar26 << 0x40,7);
        auVar28[0] = auVar55[3];
        auVar28._9_6_ = 0;
        auVar27._1_10_ = SUB1510(auVar28 << 0x30,5);
        auVar27[0] = auVar55[2];
        auVar29._11_4_ = 0;
        auVar29._0_11_ = auVar27;
        auVar24[2] = auVar55[1];
        auVar24._0_2_ = auVar55._0_2_;
        auVar24._3_12_ = SUB1512(auVar29 << 0x20,3);
        auVar25._2_13_ = auVar24._2_13_;
        auVar25._0_2_ = auVar55._0_2_ & 0xff;
        auVar58._8_4_ = auVar25._0_4_;
        auVar58._12_4_ = auVar27._0_4_;
        auVar55 = pshuflw(auVar58,auVar58,0x1b);
        auVar55 = pshufhw(auVar55,auVar55,0x1b);
        sVar2 = auVar55._0_2_;
        sVar3 = auVar55._2_2_;
        sVar4 = auVar55._4_2_;
        sVar5 = auVar55._6_2_;
        sVar6 = auVar55._8_2_;
        sVar7 = auVar55._10_2_;
        sVar8 = auVar55._12_2_;
        sVar9 = auVar55._14_2_;
        sVar10 = auVar59._0_2_;
        sVar11 = auVar59._2_2_;
        sVar12 = auVar59._4_2_;
        sVar13 = auVar59._6_2_;
        sVar14 = auVar59._8_2_;
        sVar15 = auVar59._10_2_;
        sVar16 = auVar59._12_2_;
        sVar17 = auVar59._14_2_;
        lVar39 = lVar35 * 8;
        *(char *)(&local_338 + lVar35) = (0 < sVar2) * (sVar2 < 0x100) * auVar55[0] - (0xff < sVar2)
        ;
        *(char *)((long)&local_338 + lVar39 + 1) =
             (0 < sVar3) * (sVar3 < 0x100) * auVar55[2] - (0xff < sVar3);
        *(char *)((long)&local_338 + lVar39 + 2) =
             (0 < sVar4) * (sVar4 < 0x100) * auVar55[4] - (0xff < sVar4);
        *(char *)((long)&local_338 + lVar39 + 3) =
             (0 < sVar5) * (sVar5 < 0x100) * auVar55[6] - (0xff < sVar5);
        *(char *)((long)&local_338 + lVar39 + 4) =
             (0 < sVar6) * (sVar6 < 0x100) * auVar55[8] - (0xff < sVar6);
        *(char *)((long)&local_338 + lVar39 + 5) =
             (0 < sVar7) * (sVar7 < 0x100) * auVar55[10] - (0xff < sVar7);
        *(char *)((long)&local_338 + lVar39 + 6) =
             (0 < sVar8) * (sVar8 < 0x100) * auVar55[0xc] - (0xff < sVar8);
        *(char *)((long)&local_338 + lVar39 + 7) =
             (0 < sVar9) * (sVar9 < 0x100) * auVar55[0xe] - (0xff < sVar9);
        *(char *)(&uStack_330 + lVar35) =
             (0 < sVar10) * (sVar10 < 0x100) * auVar59[0] - (0xff < sVar10);
        *(char *)((long)&uStack_330 + lVar39 + 1) =
             (0 < sVar11) * (sVar11 < 0x100) * auVar59[2] - (0xff < sVar11);
        *(char *)((long)&uStack_330 + lVar39 + 2) =
             (0 < sVar12) * (sVar12 < 0x100) * auVar59[4] - (0xff < sVar12);
        *(char *)((long)&uStack_330 + lVar39 + 3) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar59[6] - (0xff < sVar13);
        *(char *)((long)&uStack_330 + lVar39 + 4) =
             (0 < sVar14) * (sVar14 < 0x100) * auVar59[8] - (0xff < sVar14);
        *(char *)((long)&uStack_330 + lVar39 + 5) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar59[10] - (0xff < sVar15);
        *(char *)((long)&uStack_330 + lVar39 + 6) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar59[0xc] - (0xff < sVar16);
        *(char *)((long)&uStack_330 + lVar39 + 7) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar59[0xe] - (0xff < sVar17);
        lVar35 = lVar35 + 2;
      } while (lVar35 != 0x10);
      lVar39 = 0x10;
      puVar44 = &local_338;
      puVar46 = auStack_2c8 + 2;
      for (lVar35 = 0x10; uVar36 = auStack_2c8[2], lVar35 != 0; lVar35 = lVar35 + -1) {
        *puVar46 = *puVar44;
        puVar44 = puVar44 + 1;
        puVar46 = puVar46 + 1;
      }
      do {
        uVar41 = (&uStack_330)[lVar39];
        uVar1 = auStack_2c8[lVar39];
        auStack_2c8[lVar39 + 2] =
             (uVar41 >> 7 ^
             (uVar41 << 0x38 | uVar41 >> 8) ^ (uVar41 >> 1 | (ulong)((uVar41 & 1) != 0) << 0x3f)) +
             uVar36 + (uVar1 >> 6 ^ (uVar1 << 3 | uVar1 >> 0x3d) ^ (uVar1 << 0x2d | uVar1 >> 0x13))
                      + alStack_2f0[lVar39];
        lVar39 = lVar39 + 1;
        uVar36 = uVar41;
      } while (lVar39 != 0x50);
      lVar35 = 0;
      uVar36 = uVar33;
      uVar41 = uVar37;
      uVar42 = uVar43;
      uVar1 = uVar32;
      uVar30 = uVar52;
      uVar31 = uVar49;
      uVar40 = uVar51;
      uVar54 = uVar38;
      do {
        uVar53 = uVar54;
        uVar50 = uVar40;
        uVar48 = uVar31;
        uVar47 = uVar30;
        uVar45 = uVar1;
        uVar40 = uVar41;
        lVar39 = (~uVar53 & uVar45) + (uVar47 & uVar53) + uVar36 +
                 ((uVar53 << 0x17 | uVar53 >> 0x29) ^
                 (uVar53 << 0x2e | uVar53 >> 0x12) ^ (uVar53 << 0x32 | uVar53 >> 0xe)) +
                 *(long *)((long)&sha512_constants<void>::K + lVar35) +
                 *(long *)((long)auStack_2c8 + lVar35 + 0x10);
        uVar54 = uVar42 + lVar39;
        uVar41 = (uVar48 & uVar50 ^ (uVar48 ^ uVar50) & uVar40) +
                 ((uVar40 << 0x19 | uVar40 >> 0x27) ^
                 (uVar40 << 0x1e | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar39;
        lVar35 = lVar35 + 8;
        uVar36 = uVar45;
        uVar42 = uVar48;
        uVar1 = uVar47;
        uVar30 = uVar53;
        uVar31 = uVar50;
      } while (lVar35 != 0x280);
      uVar37 = uVar37 + uVar41;
      uVar51 = uVar51 + uVar40;
      uVar49 = uVar49 + uVar50;
      uVar43 = uVar43 + uVar48;
      uVar38 = uVar38 + uVar54;
      uVar52 = uVar52 + uVar53;
      uVar32 = uVar32 + uVar47;
      uVar33 = uVar33 + uVar45;
      (this->H)._M_elems[0] = uVar37;
      (this->H)._M_elems[1] = uVar51;
      (this->H)._M_elems[2] = uVar49;
      (this->H)._M_elems[3] = uVar43;
      (this->H)._M_elems[4] = uVar38;
      (this->H)._M_elems[5] = uVar52;
      (this->H)._M_elems[6] = uVar32;
      (this->H)._M_elems[7] = uVar33;
      sVar34 = sVar34 + 1;
      data = data + 0x80;
    } while (sVar34 != num_blks);
  }
  return;
}

Assistant:

inline void transform(const unsigned char* data, size_t num_blks)
	{
		for (size_t blk = 0; blk < num_blks; blk++)
		{
			T M[16];
			for (int i = 0; i < 16; i++)
				M[i] = byteswap(reinterpret_cast<const T*>(data)[blk * 16 + i]);

			const int rounds = N == 512 ? 80 : 64;
			T W[rounds];
			for (int t = 0; t <= 15; t++)
				W[t] = M[t];
			for (int t = 16; t < rounds; t++)
				W[t] = sha2_functions::sigma1(W[t - 2]) + W[t - 7] + sha2_functions::sigma0(W[t - 15]) + W[t - 16];

			T a = H[0];
			T b = H[1];
			T c = H[2];
			T d = H[3];
			T e = H[4];
			T f = H[5];
			T g = H[6];
			T h = H[7];

			for (int t = 0; t < rounds; t++)
			{
				T T1 = h + sha2_functions::sum1(e) + sha2_functions::Ch(e, f, g) + getK(t) + W[t];
				T T2 = sha2_functions::sum0(a) + sha2_functions::Maj(a, b, c);
				h = g;
				g = f;
				f = e;
				e = d + T1;
				d = c;
				c = b;
				b = a;
				a = T1 + T2;

			}
			H[0] += a;
			H[1] += b;
			H[2] += c;
			H[3] += d;
			H[4] += e;
			H[5] += f;
			H[6] += g;
			H[7] += h;
		}

	}